

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O1

void mod2sparse_add(mod2sparse *m1,mod2sparse *m2,mod2sparse *r)

{
  byte *pbVar1;
  int col;
  int col_00;
  uint uVar2;
  bool bVar3;
  mod2entry *pmVar4;
  ulong uVar5;
  mod2sparse *r_00;
  mod2entry *pmVar6;
  void *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  
  if ((((m1->n_rows == r->n_rows) && (m1->n_cols == r->n_cols)) && (m2->n_rows == r->n_rows)) &&
     (m2->n_cols == r->n_cols)) {
    if ((r != m1) && (r != m2)) {
      mod2sparse_clear(r);
      if (0 < r->n_rows) {
        lVar8 = 0;
        do {
          pmVar4 = m1->rows[lVar8].right;
          pmVar6 = m2->rows[lVar8].right;
          while ((iVar7 = (int)lVar8, -1 < pmVar4->row && (-1 < pmVar6->row))) {
            col = pmVar4->col;
            col_00 = pmVar6->col;
            if (col == col_00) {
              pmVar4 = pmVar4->right;
LAB_0012321b:
              pmVar6 = pmVar6->right;
            }
            else {
              if (col_00 <= col) {
                mod2sparse_insert(r,iVar7,col_00);
                goto LAB_0012321b;
              }
              mod2sparse_insert(r,iVar7,col);
              pmVar4 = pmVar4->right;
            }
          }
          for (; -1 < pmVar4->row; pmVar4 = pmVar4->right) {
            mod2sparse_insert(r,iVar7,pmVar4->col);
          }
          for (; -1 < pmVar6->row; pmVar6 = pmVar6->right) {
            mod2sparse_insert(r,iVar7,pmVar6->col);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < r->n_rows);
      }
      return;
    }
  }
  else {
    mod2sparse_add_cold_1();
  }
  mod2sparse_add_cold_2();
  if (((m1->n_cols == m2->n_rows) && (m1->n_rows == r_00->n_rows)) && (m2->n_cols == r_00->n_cols))
  {
    if ((r_00 != m1) && (r_00 != m2)) {
      mod2sparse_clear(r_00);
      if (0 < m1->n_rows) {
        lVar8 = 0;
        do {
          if ((-1 < (m1->rows[lVar8].right)->row) && (0 < m2->n_cols)) {
            lVar9 = 0;
            do {
              pmVar4 = m1->rows[lVar8].right;
              if (-1 < pmVar4->row) {
                pmVar6 = m2->cols[lVar9].down;
                bVar3 = false;
                do {
                  iVar7 = pmVar6->row;
                  if (iVar7 < 0) break;
                  if (pmVar4->col == iVar7) {
                    bVar3 = (bool)(bVar3 ^ 1);
                    pmVar4 = pmVar4->right;
LAB_0012332e:
                    pmVar6 = pmVar6->down;
                  }
                  else {
                    if (iVar7 <= pmVar4->col) goto LAB_0012332e;
                    pmVar4 = pmVar4->right;
                  }
                } while (-1 < pmVar4->row);
                if (bVar3) {
                  mod2sparse_insert(r_00,(int)lVar8,(int)lVar9);
                }
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < m2->n_cols);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < m1->n_rows);
      }
      return;
    }
  }
  else {
    mod2sparse_multiply_cold_1();
  }
  mod2sparse_multiply_cold_2();
  uVar2 = m1->n_cols;
  if (0 < (long)m1->n_rows) {
    memset(__s,0,(long)m1->n_rows);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      if (*(char *)((long)&m2->n_rows + uVar5) != '\0') {
        for (pmVar4 = m1->cols[uVar5].down; -1 < pmVar4->row; pmVar4 = pmVar4->down) {
          pbVar1 = (byte *)((long)__s + (ulong)(uint)pmVar4->row);
          *pbVar1 = *pbVar1 ^ 1;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != uVar2);
  }
  return;
}

Assistant:

void mod2sparse_add
( mod2sparse *m1,	/* Left operand of add */
  mod2sparse *m2,	/* Right operand of add */
  mod2sparse *r		/* Place to store result of add */
)
{
  mod2entry *e1, *e2;
  int i;

  if (mod2sparse_rows(m1)!=mod2sparse_rows(r) 
   || mod2sparse_cols(m1)!=mod2sparse_cols(r) 
   || mod2sparse_rows(m2)!=mod2sparse_rows(r)
   || mod2sparse_cols(m2)!=mod2sparse_cols(r)) 
  { fprintf(stderr,"mod2sparse_add: Matrices have different dimensions\n");
    exit(1);
  }

  if (r==m1 || r==m2)
  { fprintf(stderr,
     "mod2sparse_add: Result matrix is the same as one of the operands\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { 
    e1 = mod2sparse_first_in_row(m1,i);
    e2 = mod2sparse_first_in_row(m2,i);

    while (!mod2sparse_at_end(e1) && !mod2sparse_at_end(e2))
    { 
      if (mod2sparse_col(e1)==mod2sparse_col(e2))
      { e1 = mod2sparse_next_in_row(e1);
        e2 = mod2sparse_next_in_row(e2); 
      }

      else if (mod2sparse_col(e1)<mod2sparse_col(e2))
      { mod2sparse_insert(r,i,mod2sparse_col(e1));
        e1 = mod2sparse_next_in_row(e1);
      }

      else
      { mod2sparse_insert(r,i,mod2sparse_col(e2));
        e2 = mod2sparse_next_in_row(e2);       
      }
    }

    while (!mod2sparse_at_end(e1))
    { mod2sparse_insert(r,i,mod2sparse_col(e1));
      e1 = mod2sparse_next_in_row(e1);
    }

    while (!mod2sparse_at_end(e2))
    { mod2sparse_insert(r,i,mod2sparse_col(e2));
      e2 = mod2sparse_next_in_row(e2);
    }
  }
}